

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>::
reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  uint6 uStack_26;
  
  puVar1 = (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x38) = puVar1;
  *(pointer *)(this + 0x40) = puVar1;
  *(pointer *)(this + 0x48) = puVar2;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset
            ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(this + 8));
  *(undefined2 *)(this + 0x108) = 3;
  *(ulong *)(this + 0x10a) = (ulong)uStack_26;
  *(undefined8 *)(this + 0x112) = 0;
  *(undefined8 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x120) = 0;
  *(undefined4 *)(this + 0x128) = 0;
  *(undefined4 *)(this + 0x130) = 0;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  *(undefined8 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 0x158) = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x160)
            );
  this[0x230] = (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>)0x0;
  cVar3 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar3 != '\0') {
    return;
  }
  (**(code **)(*(long *)this + 0x38))(this);
  return;
}

Assistant:

void reset(Sourceable&& source)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }